

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall wasm::Wasm2JSBuilder::getImportName(Wasm2JSBuilder *this,Importable *imp)

{
  bool bVar1;
  Ref RVar2;
  Ref RVar3;
  char *in_RDX;
  Name name;
  IString name_00;
  IString str;
  IString name_01;
  IString name_02;
  IString IVar4;
  ValueBuilder *local_88;
  ValueBuilder *local_48;
  Importable *imp_local;
  Wasm2JSBuilder *this_local;
  char *extraout_RDX;
  char *extraout_RDX_00;
  
  name.super_IString.str._M_str = in_RDX;
  name.super_IString.str._M_len = (size_t)(imp->base).super_IString.str._M_str;
  bVar1 = needsQuoting((wasm *)(imp->base).super_IString.str._M_len,name);
  if (bVar1) {
    IVar4 = fromName(this,(imp->module).super_IString.str,Top);
    name_00.str._M_str = IVar4.str._M_str;
    local_48 = (ValueBuilder *)IVar4.str._M_len;
    name_00.str._M_len = (size_t)name_00.str._M_str;
    RVar2 = cashew::ValueBuilder::makeName(local_48,name_00);
    str.str._M_str = extraout_RDX;
    str.str._M_len = (size_t)(imp->base).super_IString.str._M_str;
    RVar3 = cashew::ValueBuilder::makeString
                      ((ValueBuilder *)(imp->base).super_IString.str._M_len,str);
    this_local = (Wasm2JSBuilder *)cashew::ValueBuilder::makeSub(RVar2,RVar3);
  }
  else {
    IVar4 = fromName(this,(imp->module).super_IString.str,Top);
    name_01.str._M_str = IVar4.str._M_str;
    local_88 = (ValueBuilder *)IVar4.str._M_len;
    name_01.str._M_len = (size_t)name_01.str._M_str;
    RVar2 = cashew::ValueBuilder::makeName(local_88,name_01);
    name_02.str._M_str = extraout_RDX_00;
    name_02.str._M_len = (size_t)(imp->base).super_IString.str._M_str;
    RVar3 = cashew::ValueBuilder::makeName
                      ((ValueBuilder *)(imp->base).super_IString.str._M_len,name_02);
    this_local = (Wasm2JSBuilder *)cashew::ValueBuilder::makeDot(RVar2,RVar3);
  }
  return (Ref)(Value *)this_local;
}

Assistant:

Ref Wasm2JSBuilder::getImportName(const Importable& imp) {
  if (needsQuoting(imp.base)) {
    return ValueBuilder::makeSub(
      ValueBuilder::makeName(fromName(imp.module, NameScope::Top)),
      ValueBuilder::makeString(imp.base));
  } else {
    return ValueBuilder::makeDot(
      ValueBuilder::makeName(fromName(imp.module, NameScope::Top)),
      ValueBuilder::makeName(imp.base));
  }
}